

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O3

char * __thiscall soul::RenderingVenue::Pimpl::renderActiveSessions(Pimpl *this,uint32_t numFrames)

{
  mutex *__mutex;
  pointer ppSVar1;
  int iVar2;
  rep rVar3;
  char *pcVar4;
  SessionImpl **s;
  pointer ppSVar5;
  
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->loadMeasurer).currentStart.__d.__r = rVar3;
  __mutex = &this->sessionListLock;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    if (numFrames == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pcVar4 = "Illegal frame count";
    }
    else {
      ppSVar1 = (this->activeSessions).
                super__Vector_base<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppSVar5 = (this->activeSessions).
                     super__Vector_base<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppSVar5 != ppSVar1;
          ppSVar5 = ppSVar5 + 1) {
        SessionImpl::render(*ppSVar5,numFrames);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      CPULoadMeasurer::stopMeasurement(&this->loadMeasurer);
      pcVar4 = (char *)0x0;
    }
    return pcVar4;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

const char* renderActiveSessions (uint32_t numFrames)
    {
        loadMeasurer.startMeasurement();

        {
            std::lock_guard<std::mutex> l (sessionListLock);

            if (numFrames == 0)
                return "Illegal frame count";

            for (auto& s : activeSessions)
                s->render (numFrames);
        }

        loadMeasurer.stopMeasurement();
        return {};
    }